

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
slang::parsing::Preprocessor::requireUInt32(Preprocessor *this,PragmaExpressionSyntax *expr)

{
  SimplePragmaExpressionSyntax *pSVar1;
  double value;
  SourceRange range;
  Token local_80;
  SVInt local_70 [2];
  Token local_50;
  undefined1 local_40 [8];
  Token token;
  anon_class_16_2_3fdfa3b0 checkResult;
  PragmaExpressionSyntax *expr_local;
  Preprocessor *this_local;
  
  token.info = (Info *)this;
  if ((expr->super_SyntaxNode).kind == SimplePragmaExpression) {
    pSVar1 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                       (&expr->super_SyntaxNode);
    local_40._0_2_ = (pSVar1->value).kind;
    local_40[2] = (pSVar1->value).field_0x2;
    local_40[3] = (pSVar1->value).numFlags.raw;
    local_40._4_4_ = (pSVar1->value).rawLen;
    token._0_8_ = (pSVar1->value).info;
    if (local_40._0_2_ == IntegerLiteral) {
      Token::intValue(&local_50);
      this_local = (Preprocessor *)
                   requireUInt32::anon_class_16_2_3fdfa3b0::operator()
                             ((anon_class_16_2_3fdfa3b0 *)&token.info,(SVInt *)&local_50);
      SVInt::~SVInt((SVInt *)&local_50);
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)this_local;
    }
    if (local_40._0_2_ == RealLiteral) {
      value = Token::realValue((Token *)local_40);
      SVInt::fromDouble(local_70,0x20,value,true);
      this_local = (Preprocessor *)
                   requireUInt32::anon_class_16_2_3fdfa3b0::operator()
                             ((anon_class_16_2_3fdfa3b0 *)&token.info,local_70);
      SVInt::~SVInt(local_70);
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)this_local;
    }
  }
  else if ((expr->super_SyntaxNode).kind == NumberPragmaExpression) {
    slang::syntax::SyntaxNode::as<slang::syntax::NumberPragmaExpressionSyntax>
              (&expr->super_SyntaxNode);
    Token::intValue(&local_80);
    this_local = (Preprocessor *)
                 requireUInt32::anon_class_16_2_3fdfa3b0::operator()
                           ((anon_class_16_2_3fdfa3b0 *)&token.info,(SVInt *)&local_80);
    SVInt::~SVInt((SVInt *)&local_80);
    return (_Optional_base<unsigned_int,_true,_true>)
           (_Optional_base<unsigned_int,_true,_true>)this_local;
  }
  range = slang::syntax::SyntaxNode::sourceRange(&expr->super_SyntaxNode);
  addDiag(this,(DiagCode)0x240004,range);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)&this_local);
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)this_local;
}

Assistant:

std::optional<uint32_t> Preprocessor::requireUInt32(const PragmaExpressionSyntax& expr) {
    auto checkResult = [&](const SVInt& svi) -> std::optional<uint32_t> {
        auto value = svi.as<int32_t>();
        if (!value || *value < 0) {
            addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
            return {};
        }

        return uint32_t(*value);
    };

    if (expr.kind == SyntaxKind::SimplePragmaExpression) {
        auto token = expr.as<SimplePragmaExpressionSyntax>().value;
        if (token.kind == TokenKind::IntegerLiteral)
            return checkResult(token.intValue());
        else if (token.kind == TokenKind::RealLiteral)
            return checkResult(SVInt::fromDouble(32, token.realValue(), true));
    }
    else if (expr.kind == SyntaxKind::NumberPragmaExpression) {
        return checkResult(expr.as<NumberPragmaExpressionSyntax>().value.intValue());
    }

    addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
    return {};
}